

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_int64_suite::fail_array8_int64_invalid_length(void)

{
  undefined4 local_4c;
  value local_48 [2];
  undefined1 local_40 [8];
  decoder decoder;
  value_type input [10];
  
  stack0xffffffffffffffee = 0x66554433221107ae;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[10]>
            ((decoder *)local_40,(uchar (*) [10])((long)&decoder.current.view._M_str + 6));
  local_48[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_40);
  local_4c = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::error_invalid_length",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xad8,"void compact_int64_suite::fail_array8_int64_invalid_length()",local_48,
             &local_4c);
  return;
}

Assistant:

void fail_array8_int64_invalid_length()
{
    const value_type input[] = { token::code::array8_int64, 0x07, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_invalid_length);
}